

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void Corrade::Utility::String::Implementation::anon_unknown_12::lowercaseInPlaceImplementation::
     anon_class_1_0_00000001::__invoke(char *data,size_t size)

{
  anon_class_1_0_00000001 local_19;
  size_t local_18;
  size_t size_local;
  char *data_local;
  
  local_18 = size;
  size_local = (size_t)data;
  operator()(&local_19,data,size);
  return;
}

Assistant:

CORRADE_UTILITY_CPU_MAYBE_UNUSED typename std::decay<decltype(lowercaseInPlace)>::type lowercaseInPlaceImplementation(Cpu::ScalarT) {
  return [](char* data, const std::size_t size) {
    /* A proper Unicode-aware *and* locale-aware solution would involve far
       more than iterating over bytes -- multi-byte characters, composed
       characters (ä formed from ¨ and a), SS -> ß in German but not elsewhere
       etc... */

    /* Branchless idea from https://stackoverflow.com/a/3884737, what it does
       is adding (1 << 5) for 'A' and all 26 letters after, and (0 << 5) for
       anything after (and before as well, which is what the unsigned cast
       does). The (1 << 5) bit (0x20) is what differs between lowercase and
       uppercase characters. See Test/StringBenchmark.cpp for other alternative
       implementations leading up to this point. In particular, the
       std::uint8_t() is crucial, unsigned() is 6x to 8x slower. */
    const char* const end = data + size;
    for(char* c = data; c != end; ++c)
        *c += (std::uint8_t(*c - 'A') < 26) << 5;
  };
}